

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_23::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  char local_32 [2];
  string expr;
  
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    expr._M_dataplus._M_p._0_1_ = 0;
    Colour::use(FileName);
    std::operator<<(this->stream," for: ");
    Colour::~Colour((Colour *)&expr);
    AssertionResult::getExpandedExpression_abi_cxx11_(&expr,this->result);
    __first._M_current._1_7_ = expr._M_dataplus._M_p._1_7_;
    __first._M_current._0_1_ = expr._M_dataplus._M_p._0_1_;
    local_32[1] = 10;
    local_32[0] = ' ';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + expr._M_string_length),local_32 + 1,local_32);
    std::operator<<(this->stream,(string *)&expr);
    std::__cxx11::string::~string((string *)&expr);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    {
                        Colour colour(dimColour());
                        stream << " for: ";
                    }
                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }